

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  pointer __dest;
  bool bVar1;
  string *buffer;
  LogMessage *other;
  size_t __n;
  LogFinisher local_5d;
  uint32 local_5c;
  LogMessage local_58;
  
  buffer = *p;
  if (buffer == (string *)&fixed_address_empty_string_abi_cxx11_) {
    buffer = (string *)operator_new(0x20);
    (buffer->_M_dataplus)._M_p = (pointer)&buffer->field_2;
    buffer->_M_string_length = 0;
    (buffer->field_2)._M_local_buf[0] = '\0';
    *p = buffer;
  }
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_5c);
  if ((bVar1) && (__n = (size_t)(int)local_5c, -1 < (long)__n)) {
    if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < (int)local_5c) {
      bVar1 = io::CodedInputStream::ReadStringFallback(input,buffer,local_5c);
      return bVar1;
    }
    std::__cxx11::string::resize((ulong)buffer);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                 ,0x3c);
      other = LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      LogFinisher::operator=(&local_5d,other);
      LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,input->buffer_,__n);
    input->buffer_ = input->buffer_ + __n;
    return true;
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string** p) {
  if (*p == &::google::protobuf::internal::GetEmptyStringAlreadyInited()) {
    *p = new ::std::string();
  }
  return ReadBytesToString(input, *p);
}